

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AY38910.hpp
# Opt level: O0

void __thiscall GI::AY38910::State::State(State *this)

{
  bool bVar1;
  uint8_t *local_78;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_41;
  string local_40;
  State *local_10;
  State *this_local;
  
  local_10 = this;
  Reflection::StructImpl<GI::AY38910::State>::StructImpl
            (&this->super_StructImpl<GI::AY38910::State>);
  (this->super_StructImpl<GI::AY38910::State>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__00cab148;
  local_78 = this->registers;
  do {
    *local_78 = '\0';
    local_78 = local_78 + 1;
  } while (local_78 != &this->selected_register);
  this->selected_register = '\0';
  bVar1 = Reflection::StructImpl<GI::AY38910::State>::needs_declare
                    (&this->super_StructImpl<GI::AY38910::State>);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"registers",&local_41);
    Reflection::StructImpl<GI::AY38910::State>::declare<unsigned_char[16]>
              (&this->super_StructImpl<GI::AY38910::State>,&this->registers,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"selected_register",&local_69);
    Reflection::StructImpl<GI::AY38910::State>::declare<unsigned_char>
              (&this->super_StructImpl<GI::AY38910::State>,&this->selected_register,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  return;
}

Assistant:

State() {
		if(needs_declare()) {
			DeclareField(registers);
			DeclareField(selected_register);
		}
	}